

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Protector.cpp
# Opt level: O3

void __thiscall
CppUnit::Protector::reportError(Protector *this,ProtectorContext *context,Exception *error)

{
  Exception *this_00;
  Exception *this_01;
  Message local_100;
  Message local_88;
  
  this_00 = (Exception *)(**(code **)(*(long *)error + 0x18))(error);
  this_01 = this_00;
  Exception::message(&local_100,this_00);
  actualMessage(&local_88,(Protector *)this_01,&local_100,context);
  Exception::setMessage(this_00,&local_88);
  Message::~Message(&local_88);
  Message::~Message(&local_100);
  (*(context->m_result->super_SynchronizedObject)._vptr_SynchronizedObject[9])
            (context->m_result,context->m_test,this_00);
  return;
}

Assistant:

void 
Protector::reportError( const ProtectorContext &context,
                        const Exception &error ) const
{
  std::auto_ptr<Exception> actualError( error.clone() );
  actualError->setMessage( actualMessage( actualError->message(), context ) );
  context.m_result->addError( context.m_test, 
                              actualError.release() );
}